

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-metadce.cpp
# Opt level: O2

void __thiscall MetaDCEGraph::printAllUnused(MetaDCEGraph *this)

{
  iterator iVar1;
  ostream *poVar2;
  _Rb_tree_node_base *p_Var3;
  __node_base *p_Var4;
  string local_80;
  undefined1 local_60 [8];
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unused;
  
  unused._M_t._M_impl._0_4_ = 0;
  unused._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  unused._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  unused._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  p_Var4 = &(this->nodes)._M_h._M_before_begin;
  unused._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Rb_tree_node_base *)&unused;
  unused._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Rb_tree_node_base *)&unused;
  while (p_Var4 = p_Var4->_M_nxt,
        p_Var3 = unused._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,
        p_Var4 != (__node_base *)0x0) {
    iVar1 = std::
            _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
            ::find(&(this->reached)._M_h,(key_type *)(p_Var4 + 1));
    if (iVar1.super__Node_iterator_base<wasm::Name,_true>._M_cur == (__node_type *)0x0) {
      wasm::IString::toString_abi_cxx11_(&local_80,(IString *)(p_Var4 + 1));
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)local_60,&local_80);
      std::__cxx11::string::~string((string *)&local_80);
    }
  }
  for (; p_Var3 != (_Rb_tree_node_base *)&unused;
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
    poVar2 = std::operator<<((ostream *)&std::cout,"unused: ");
    poVar2 = std::operator<<(poVar2,(string *)(p_Var3 + 1));
    std::operator<<(poVar2,'\n');
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_60);
  return;
}

Assistant:

void printAllUnused() {
    std::set<std::string> unused;
    for (auto& [name, _] : nodes) {
      if (reached.find(name) == reached.end()) {
        unused.insert(name.toString());
      }
    }
    for (auto& name : unused) {
      std::cout << "unused: " << name << '\n';
    }
  }